

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageTemplate.cpp
# Opt level: O0

void __thiscall
ki::protocol::dml::MessageTemplate::set_handler(MessageTemplate *this,string *handler)

{
  Record *this_00;
  Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_01;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  string *local_18;
  string *handler_local;
  MessageTemplate *this_local;
  
  this_00 = this->m_record;
  local_18 = handler;
  handler_local = &this->m_name;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"_MsgHandler",&local_39);
  this_01 = ki::dml::Record::add_field<std::__cxx11::string>(this_00,(string *)local_38,true);
  std::__cxx11::string::string(local_70,(string *)handler);
  ki::dml::Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  set_value(this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

void MessageTemplate::set_handler(std::string handler)
	{
		m_record->add_field<ki::dml::STR>("_MsgHandler")->set_value(handler);
	}